

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# info.cpp
# Opt level: O0

void setup::anon_unknown_21::load_wizard_and_decompressor
               (istream *is,version *version,header *header,info *info,entry_types entries)

{
  flags<setup::directory_entry::flags_Enum_,_5UL> o;
  flags<setup::directory_entry::flags_Enum_,_5UL> o_00;
  bool bVar1;
  uint uVar2;
  int iVar3;
  TypesafeBoolean p_Var4;
  long in_RCX;
  long in_RDX;
  int_adapter<unsigned_int> *in_RSI;
  istream *in_RDI;
  enum_type in_stack_ffffffffffffff68;
  enum_type in_stack_ffffffffffffff6c;
  istream *in_stack_ffffffffffffff70;
  undefined4 in_stack_ffffffffffffff78;
  enum_type in_stack_ffffffffffffff7c;
  istream *in_stack_ffffffffffffff80;
  iterator<boost::unordered::detail::ptr_node<std::pair<unsigned_int_const,void*>>> local_78 [8];
  Type local_70;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *in_stack_ffffffffffffff98;
  undefined1 in_stack_ffffffffffffffa0 [16];
  _Base_bitset<1UL> in_stack_ffffffffffffffb0;
  
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::clear((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           *)0x1787ca);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::clear((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           *)0x1787db);
  load_wizard_images(in_stack_ffffffffffffffa0._8_8_,in_stack_ffffffffffffffa0._0_8_,
                     in_stack_ffffffffffffff98,(entry_types)in_stack_ffffffffffffffb0._M_w);
  uVar2 = boost::date_time::int_adapter<unsigned_int>::as_number(in_RSI);
  if ((0x1ffffff < uVar2) ||
     (bVar1 = setup::version::is_isx((version *)in_stack_ffffffffffffff70), bVar1)) {
    load_wizard_images(in_stack_ffffffffffffffa0._8_8_,in_stack_ffffffffffffffa0._0_8_,
                       in_stack_ffffffffffffff98,(entry_types)in_stack_ffffffffffffffb0._M_w);
  }
  std::__cxx11::string::clear();
  if (((*(int *)(in_RDX + 0x640) == 2) ||
      ((*(int *)(in_RDX + 0x640) == 3 &&
       (iVar3 = boost::date_time::int_adapter<unsigned_int>::as_number(in_RSI), iVar3 == 0x4010500))
      )) || ((*(int *)(in_RDX + 0x640) == 1 &&
             (uVar2 = boost::date_time::int_adapter<unsigned_int>::as_number(in_RSI),
             0x40205ff < uVar2)))) {
    operator|(in_stack_ffffffffffffff6c,in_stack_ffffffffffffff68);
    o._flags.super__Base_bitset<1UL>._M_w._4_4_ = in_stack_ffffffffffffff7c;
    o._flags.super__Base_bitset<1UL>._M_w._0_4_ = in_stack_ffffffffffffff78;
    flags<setup::directory_entry::flags_Enum_,_5UL>::operator&
              ((flags<setup::directory_entry::flags_Enum_,_5UL> *)in_stack_ffffffffffffff70,o);
    p_Var4 = ::flags::operator_cast_to_function_pointer
                       ((flags<setup::directory_entry::flags_Enum_,_5UL> *)0x178904);
    if (p_Var4 == (TypesafeBoolean)0x0) {
      util::binary_string::skip(in_stack_ffffffffffffff70);
    }
    else {
      in_stack_ffffffffffffff80 = in_RDI;
      boost::unordered::iterator_detail::
      iterator<boost::unordered::detail::ptr_node<std::pair<unsigned_int_const,void*>>>::iterator
                ((iterator<boost::unordered::detail::ptr_node<std::pair<unsigned_int_const,void*>>>
                  *)&stack0xffffffffffffffb0,(slice_reader *)(in_RCX + 0x850));
      util::operator>>(in_stack_ffffffffffffff70,
                       (binary_string *)
                       CONCAT44(in_stack_ffffffffffffff6c,in_stack_ffffffffffffff68));
    }
  }
  std::__cxx11::string::clear();
  flags<setup::header::flags_Enum_,_65UL>::operator&
            ((flags<setup::header::flags_Enum_,_65UL> *)in_stack_ffffffffffffff80,
             in_stack_ffffffffffffff7c);
  p_Var4 = ::flags::operator_cast_to_function_pointer
                     ((flags<setup::header::flags_Enum_,_65UL> *)0x178988);
  in_stack_ffffffffffffff7c = in_stack_ffffffffffffff7c & 0xffffff;
  if (p_Var4 != (TypesafeBoolean)0x0) {
    uVar2 = boost::date_time::int_adapter<unsigned_int>::as_number(in_RSI);
    in_stack_ffffffffffffff7c = CONCAT13(uVar2 < 0x6040000,(int3)in_stack_ffffffffffffff7c);
  }
  if ((char)(in_stack_ffffffffffffff7c >> 0x18) != '\0') {
    local_70.super__Base_bitset<1UL>._M_w =
         (_Base_bitset<1UL>)operator|(in_stack_ffffffffffffff6c,in_stack_ffffffffffffff68);
    o_00._flags.super__Base_bitset<1UL>._M_w._4_4_ = in_stack_ffffffffffffff7c;
    o_00._flags.super__Base_bitset<1UL>._M_w._0_4_ = in_stack_ffffffffffffff78;
    flags<setup::directory_entry::flags_Enum_,_5UL>::operator&
              ((flags<setup::directory_entry::flags_Enum_,_5UL> *)in_stack_ffffffffffffff70,o_00);
    p_Var4 = ::flags::operator_cast_to_function_pointer
                       ((flags<setup::directory_entry::flags_Enum_,_5UL> *)0x1789ef);
    if (p_Var4 == (TypesafeBoolean)0x0) {
      util::binary_string::skip(in_stack_ffffffffffffff70);
    }
    else {
      boost::unordered::iterator_detail::
      iterator<boost::unordered::detail::ptr_node<std::pair<unsigned_int_const,void*>>>::iterator
                (local_78,(slice_reader *)(in_RCX + 0x870));
      util::operator>>(in_RDI,(binary_string *)
                              CONCAT44(in_stack_ffffffffffffff6c,in_stack_ffffffffffffff68));
    }
  }
  return;
}

Assistant:

void load_wizard_and_decompressor(std::istream & is, const setup::version & version,
                                  const setup::header & header,
                                  setup::info & info, info::entry_types entries) {
	
	info.wizard_images.clear();
	info.wizard_images_small.clear();
	
	load_wizard_images(is, version, info.wizard_images, entries);
	
	if(version >= INNO_VERSION(2, 0, 0) || version.is_isx()) {
		load_wizard_images(is, version, info.wizard_images_small, entries);
	}
	
	info.decompressor_dll.clear();
	if(header.compression == stream::BZip2
	   || (header.compression == stream::LZMA1 && version == INNO_VERSION(4, 1, 5))
	   || (header.compression == stream::Zlib && version >= INNO_VERSION(4, 2, 6))) {
		if(entries & (info::DecompressorDll | info::NoSkip)) {
			is >> util::binary_string(info.decompressor_dll);
		} else {
			// decompressor dll - we don't need this
			util::binary_string::skip(is);
		}
	}
	
	info.decrypt_dll.clear();
	if((header.options & header::EncryptionUsed) && version < INNO_VERSION(6, 4, 0)) {
		if(entries & (info::DecryptDll | info::NoSkip)) {
			is >> util::binary_string(info.decrypt_dll);
		} else {
			// decrypt dll - we don't need this
			util::binary_string::skip(is);
		}
	}
	
}